

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O3

void UnityAssertFloatsWithin(_UF delta,_UF expected,_UF actual,char *msg,_U_UINT lineNumber)

{
  float fVar1;
  
  if (Unity.CurrentTestIgnored == 0 && Unity.CurrentTestFailed == 0) {
    fVar1 = actual - expected;
    fVar1 = (float)(~-(uint)(fVar1 < 0.0) & (uint)fVar1 | (uint)(0.0 - fVar1) & -(uint)(fVar1 < 0.0)
                   );
    if (((float)(~-(uint)(delta < 0.0) & (uint)delta | (uint)(0.0 - delta) & -(uint)(delta < 0.0)) <
         fVar1) || (0x7f7fffff < (uint)ABS(fVar1))) {
      UnityTestResultsFailBegin(lineNumber);
      UnityPrint(" Values Not Within Delta ");
      UnityAddMsgIfSpecified(msg);
      Unity.CurrentTestFailed = 1;
      longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
    }
  }
  return;
}

Assistant:

void UnityAssertFloatsWithin(const _UF delta,
                             const _UF expected,
                             const _UF actual,
                             const char* msg,
                             const UNITY_LINE_TYPE lineNumber)
{
    _UF diff = actual - expected;
    _UF pos_delta = delta;

    UNITY_SKIP_EXECUTION;

    if (diff < 0.0f)
    {
        diff = 0.0f - diff;
    }
    if (pos_delta < 0.0f)
    {
        pos_delta = 0.0f - pos_delta;
    }

    /* This first part of this condition will catch any NaN or Infinite values */
    if (isnan(diff) || isinf(diff) || (pos_delta < diff))
    {
        UnityTestResultsFailBegin(lineNumber);
#ifdef UNITY_FLOAT_VERBOSE
        UnityPrint(UnityStrExpected);
        UnityPrintFloat(expected);
        UnityPrint(UnityStrWas);
        UnityPrintFloat(actual);
#else
        UnityPrint(UnityStrDelta);
#endif
        UnityAddMsgIfSpecified(msg);
        UNITY_FAIL_AND_BAIL;
    }
}